

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImDrawList::ImDrawList(ImDrawList *this,ImDrawListSharedData *shared_data)

{
  ImDrawListSharedData *shared_data_local;
  ImDrawList *this_local;
  
  ImVector<ImDrawCmd>::ImVector(&this->CmdBuffer);
  ImVector<unsigned_short>::ImVector(&this->IdxBuffer);
  ImVector<ImDrawVert>::ImVector(&this->VtxBuffer);
  ImVector<ImVec4>::ImVector(&this->_ClipRectStack);
  ImVector<void_*>::ImVector(&this->_TextureIdStack);
  ImVector<ImVec2>::ImVector(&this->_Path);
  ImDrawCmdHeader::ImDrawCmdHeader(&this->_CmdHeader);
  ImDrawListSplitter::ImDrawListSplitter(&this->_Splitter);
  memset(this,0,200);
  this->_Data = shared_data;
  return;
}

Assistant:

ImDrawList(const ImDrawListSharedData* shared_data) { memset(this, 0, sizeof(*this)); _Data = shared_data; }